

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int luv_fs_scandir_next(lua_State *L)

{
  int iVar1;
  uv_fs_t *req;
  char *s;
  bool bVar2;
  uv_dirent_t ent;
  uv_dirent_t local_20;
  
  req = (uv_fs_t *)luaL_checkudata(L,1,"uv_req");
  bVar2 = req->data != (void *)0x0;
  req->type = (uint)bVar2;
  if (!bVar2) {
    luaL_argerror(L,1,"Expected uv_fs_t");
  }
  iVar1 = uv_fs_scandir_next(req,&local_20);
  if (iVar1 == -0xfff) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 0;
  }
  else if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    lua_pushstring(L,local_20.name);
    switch(local_20.type) {
    case UV_DIRENT_UNKNOWN:
      return 1;
    case UV_DIRENT_FILE:
      s = "file";
      break;
    case UV_DIRENT_DIR:
      s = "directory";
      break;
    case UV_DIRENT_LINK:
      s = "link";
      break;
    case UV_DIRENT_FIFO:
      s = "fifo";
      break;
    case UV_DIRENT_SOCKET:
      s = "socket";
      break;
    case UV_DIRENT_CHAR:
      s = "char";
      break;
    case UV_DIRENT_BLOCK:
      s = "block";
      break;
    default:
      s = "unknown";
    }
    lua_pushstring(L,s);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int luv_fs_scandir_next(lua_State* L) {
  uv_fs_t* req = luv_check_fs(L, 1);
  uv_dirent_t ent;
  int ret = uv_fs_scandir_next(req, &ent);
  if (ret == UV_EOF) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    req->data = NULL;
    uv_fs_req_cleanup(req);
    return 0;
  }
  if (ret < 0) return luv_error(L, ret);
  return luv_push_dirent(L, &ent, 0);
}